

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup3.c
# Opt level: O2

uint32_t ATLget_hash(char *str)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  sVar3 = strlen(str);
  uVar5 = (int)sVar3 + 0xdeadbeef;
  uVar8 = uVar5;
  uVar1 = uVar5;
  if (((ulong)str & 3) != 0) {
    if (((ulong)str & 1) != 0) {
      pbVar4 = (byte *)(str + 0xb);
      do {
        switch(sVar3) {
        case 0:
          goto switchD_001064bf_caseD_0;
        case 0xc:
          uVar1 = uVar1 + (uint)*pbVar4 * 0x1000000;
        case 0xb:
          uVar1 = uVar1 + (uint)pbVar4[-1] * 0x10000;
        case 10:
          uVar1 = uVar1 + (uint)pbVar4[-2] * 0x100;
        case 9:
          uVar1 = uVar1 + pbVar4[-3];
        case 8:
          uVar8 = uVar8 + (uint)pbVar4[-4] * 0x1000000;
        case 7:
          uVar8 = uVar8 + (uint)pbVar4[-5] * 0x10000;
        case 6:
          uVar8 = uVar8 + (uint)pbVar4[-6] * 0x100;
        case 5:
          uVar8 = uVar8 + pbVar4[-7];
        case 4:
          uVar5 = uVar5 + (uint)pbVar4[-8] * 0x1000000;
        case 3:
          uVar5 = uVar5 + (uint)pbVar4[-9] * 0x10000;
        case 2:
          uVar5 = uVar5 + (uint)pbVar4[-10] * 0x100;
        case 1:
          uVar6 = (uint)pbVar4[-0xb];
          goto LAB_001065b0;
        default:
          iVar2 = (uint)pbVar4[-4] * 0x1000000 + (uint)pbVar4[-5] * 0x10000 +
                  (uint)pbVar4[-6] * 0x100 + uVar8 + pbVar4[-7];
          uVar1 = (uint)*pbVar4 * 0x1000000 + (uint)pbVar4[-1] * 0x10000 +
                  (uint)pbVar4[-2] * 0x100 + uVar1 + pbVar4[-3];
          uVar8 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^
                  ((uint)pbVar4[-8] * 0x1000000 + (uint)pbVar4[-9] * 0x10000 +
                  (uint)pbVar4[-10] * 0x100 + uVar5 + pbVar4[-0xb]) - uVar1;
          iVar7 = uVar1 + iVar2;
          uVar1 = (uVar8 << 6 | uVar8 >> 0x1a) ^ iVar2 - uVar8;
          iVar2 = uVar8 + iVar7;
          uVar8 = (uVar1 << 8 | uVar1 >> 0x18) ^ iVar7 - uVar1;
          iVar7 = uVar1 + iVar2;
          uVar5 = (uVar8 << 0x10 | uVar8 >> 0x10) ^ iVar2 - uVar8;
          iVar2 = uVar8 + iVar7;
          uVar8 = (uVar5 << 0x13 | uVar5 >> 0xd) ^ iVar7 - uVar5;
          uVar5 = uVar5 + iVar2;
          uVar1 = (uVar8 << 4 | uVar8 >> 0x1c) ^ iVar2 - uVar8;
          uVar8 = uVar8 + uVar5;
          sVar3 = sVar3 - 0xc;
          pbVar4 = pbVar4 + 0xc;
        }
      } while( true );
    }
LAB_001062e2:
    switch(sVar3) {
    case 0:
      goto switchD_001064bf_caseD_0;
    case 1:
      uVar6 = (uint)(byte)*(uint *)str;
      goto LAB_001065cb;
    case 2:
      goto switchD_001064bf_caseD_2;
    case 3:
      uVar5 = uVar5 + (uint)*(byte *)((long)str + 2) * 0x10000;
      goto switchD_001064bf_caseD_2;
    case 4:
      goto switchD_001064bf_caseD_4;
    case 5:
      uVar6 = (uint)(byte)*(uint *)((long)str + 4);
      goto LAB_001065c7;
    case 6:
      goto switchD_001064bf_caseD_6;
    case 7:
      uVar8 = uVar8 + (uint)*(byte *)((long)str + 6) * 0x10000;
switchD_001064bf_caseD_6:
      uVar6 = (uint)(ushort)*(uint *)((long)str + 4);
LAB_001065c7:
      uVar8 = uVar8 + uVar6;
      goto switchD_001064bf_caseD_4;
    case 8:
      break;
    case 9:
      uVar1 = uVar1 + (byte)*(uint *)((long)str + 8);
      break;
    case 10:
      goto switchD_001064bf_caseD_a;
    case 0xb:
      uVar1 = uVar1 + (uint)*(byte *)((long)str + 10) * 0x10000;
switchD_001064bf_caseD_a:
      uVar8 = uVar8 + *(uint *)((long)str + 4);
      uVar1 = uVar1 + (ushort)*(uint *)((long)str + 8);
      goto switchD_001064bf_caseD_4;
    case 0xc:
      uVar1 = uVar1 + *(uint *)((long)str + 8);
      break;
    default:
      goto switchD_001064bf_default;
    }
    uVar8 = uVar8 + *(uint *)((long)str + 4);
switchD_001064bf_caseD_4:
    uVar6 = *(uint *)str;
LAB_001065cb:
    uVar6 = uVar5 + uVar6;
    goto LAB_001065cd;
  }
LAB_00106354:
  switch(sVar3) {
  case 0:
switchD_001064bf_caseD_0:
    return uVar1;
  case 1:
    uVar6 = (uint)(byte)*(uint *)str;
    goto LAB_001065b0;
  case 2:
switchD_001064bf_caseD_2:
    uVar6 = (uint)(ushort)*(uint *)str;
LAB_001065b0:
    uVar6 = uVar6 + uVar5;
LAB_001065cd:
    uVar1 = (uVar1 ^ uVar8) - (uVar8 << 0xe | uVar8 >> 0x12);
    uVar5 = (uVar6 ^ uVar1) - (uVar1 * 0x800 | uVar1 >> 0x15);
    uVar6 = (uVar8 ^ uVar5) - (uVar5 * 0x2000000 | uVar5 >> 7);
    uVar8 = (uVar1 ^ uVar6) - (uVar6 * 0x10000 | uVar6 >> 0x10);
    uVar1 = (uVar5 ^ uVar8) - (uVar8 * 0x10 | uVar8 >> 0x1c);
    uVar1 = (uVar6 ^ uVar1) - (uVar1 * 0x4000 | uVar1 >> 0x12);
    return (uVar8 ^ uVar1) - (uVar1 * 0x1000000 | uVar1 >> 8);
  case 3:
    uVar6 = *(uint *)str & 0xffffff;
    goto LAB_001065b0;
  case 4:
    goto switchD_001063cc_caseD_4;
  case 5:
    uVar6 = (uint)(byte)*(uint *)((long)str + 4);
    break;
  case 6:
    uVar6 = (uint)(ushort)*(uint *)((long)str + 4);
    break;
  case 7:
    uVar6 = *(uint *)((long)str + 4) & 0xffffff;
    break;
  case 8:
    goto switchD_001063cc_caseD_8;
  case 9:
    uVar6 = (uint)(byte)*(uint *)((long)str + 8);
    goto LAB_00106577;
  case 10:
    uVar6 = (uint)(ushort)*(uint *)((long)str + 8);
    goto LAB_00106577;
  case 0xb:
    uVar6 = *(uint *)((long)str + 8) & 0xffffff;
LAB_00106577:
    uVar1 = uVar1 + uVar6;
switchD_001063cc_caseD_8:
    uVar8 = uVar8 + *(uint *)((long)str + 4);
    goto switchD_001063cc_caseD_4;
  case 0xc:
    uVar1 = uVar1 + *(uint *)((long)str + 8);
    goto switchD_001063cc_caseD_8;
  default:
    goto switchD_001063cc_default;
  }
  uVar8 = uVar8 + uVar6;
switchD_001063cc_caseD_4:
  uVar6 = *(uint *)str;
  goto LAB_001065b0;
switchD_001064bf_default:
  uVar1 = uVar1 + *(uint *)((long)str + 8);
  uVar5 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (uVar5 + *(uint *)str) - uVar1;
  iVar2 = uVar1 + uVar8 + *(uint *)((long)str + 4);
  uVar8 = (uVar5 << 6 | uVar5 >> 0x1a) ^ (uVar8 + *(uint *)((long)str + 4)) - uVar5;
  iVar7 = uVar5 + iVar2;
  uVar1 = (uVar8 << 8 | uVar8 >> 0x18) ^ iVar2 - uVar8;
  iVar2 = uVar8 + iVar7;
  uVar5 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar7 - uVar1;
  iVar7 = uVar1 + iVar2;
  uVar1 = (uVar5 << 0x13 | uVar5 >> 0xd) ^ iVar2 - uVar5;
  uVar5 = uVar5 + iVar7;
  sVar3 = sVar3 - 0xc;
  str = (char *)((long)str + 0xc);
  uVar8 = uVar1 + uVar5;
  uVar1 = (uVar1 << 4 | uVar1 >> 0x1c) ^ iVar7 - uVar1;
  goto LAB_001062e2;
switchD_001063cc_default:
  uVar1 = uVar1 + *(uint *)((long)str + 8);
  uVar5 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (uVar5 + *(uint *)str) - uVar1;
  iVar2 = uVar1 + uVar8 + *(uint *)((long)str + 4);
  uVar8 = (uVar5 << 6 | uVar5 >> 0x1a) ^ (uVar8 + *(uint *)((long)str + 4)) - uVar5;
  iVar7 = uVar5 + iVar2;
  uVar1 = (uVar8 << 8 | uVar8 >> 0x18) ^ iVar2 - uVar8;
  iVar2 = uVar8 + iVar7;
  uVar5 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar7 - uVar1;
  iVar7 = uVar1 + iVar2;
  uVar1 = (uVar5 << 0x13 | uVar5 >> 0xd) ^ iVar2 - uVar5;
  uVar5 = uVar5 + iVar7;
  sVar3 = sVar3 - 0xc;
  str = (char *)((long)str + 0xc);
  uVar8 = uVar1 + uVar5;
  uVar1 = (uVar1 << 4 | uVar1 >> 0x1c) ^ iVar7 - uVar1;
  goto LAB_00106354;
}

Assistant:

uint32_t
ATLget_hash(const char*str)
{
    return hashlittle(str, strlen(str), 0);
}